

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O2

void __thiscall CFG::eliminateUselessSymbols(CFG *this)

{
  ostream *poVar1;
  
  eliminateNonGeneratingSymbols(this);
  poVar1 = std::operator<<((ostream *)&std::cout,"Eliminated non-generating symbols: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  printReadable(this);
  eliminateNonReachableSymbols(this);
  poVar1 = std::operator<<((ostream *)&std::cout,"Eliminated non-reachable symbols: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  printReadable(this);
  return;
}

Assistant:

void CFG::eliminateUselessSymbols() {
    eliminateNonGeneratingSymbols();

    std::cout << "Eliminated non-generating symbols: " << std::endl;
    printReadable();

    eliminateNonReachableSymbols();

    std::cout << "Eliminated non-reachable symbols: " << std::endl;
    printReadable();
}